

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_or(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  uint uVar2;
  TCGv_i64 pTVar3;
  TCGv_i32 arg1;
  uint uVar4;
  uintptr_t o;
  TCGContext_conflict10 *tcg_ctx;
  uint uVar5;
  uintptr_t o_1;
  int64_t arg2;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode;
  uVar2 = uVar1 >> 0x15 & 0x1f;
  uVar5 = uVar1 >> 0x10 & 0x1f;
  uVar4 = uVar1 >> 0xb & 0x1f;
  if (uVar2 != uVar4 || uVar2 != uVar5) {
    if (uVar2 == uVar4) {
      tcg_gen_mov_i64_ppc64(tcg_ctx,cpu_gpr[uVar5],cpu_gpr[uVar2]);
    }
    else {
      tcg_gen_or_i64_ppc64(tcg_ctx,cpu_gpr[uVar5],cpu_gpr[uVar2],cpu_gpr[uVar4]);
    }
    if ((ctx->opcode & 1) == 0) {
      return;
    }
    pTVar3 = cpu_gpr[uVar5];
LAB_009f267f:
    gen_set_Rc0(ctx,pTVar3);
    return;
  }
  if ((uVar1 & 1) != 0) {
    pTVar3 = cpu_gpr[uVar2];
    goto LAB_009f267f;
  }
  if (uVar2 == 0) {
    return;
  }
  switch(uVar2) {
  case 1:
    arg2 = 0x8000000000000;
    break;
  case 2:
    arg2 = 0x10000000000000;
    break;
  case 3:
    if (ctx->pr != false) goto switchD_009f24db_caseD_4;
    arg2 = 0x18000000000000;
    break;
  case 4:
    goto switchD_009f24db_caseD_4;
  case 5:
    if (ctx->pr != false) goto switchD_009f24db_caseD_4;
    arg2 = 0x14000000000000;
    break;
  case 6:
    arg2 = 0xc000000000000;
    break;
  case 7:
    if ((ctx->hv != true) || (ctx->pr != false)) goto switchD_009f24db_caseD_4;
    arg2 = 0x1c000000000000;
    break;
  default:
    if ((uVar2 != 0x1f) || (ctx->pr != false)) goto switchD_009f24db_caseD_4;
    arg2 = 0x4000000000000;
  }
  pTVar3 = tcg_temp_new_i64(tcg_ctx);
  gen_load_spr(tcg_ctx,pTVar3,0x380);
  tcg_gen_andi_i64_ppc64(tcg_ctx,pTVar3,pTVar3,-0x1c000000000001);
  tcg_gen_ori_i64_ppc64(tcg_ctx,pTVar3,pTVar3,arg2);
  gen_store_spr(tcg_ctx,0x380,pTVar3);
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
  tcg_ctx = ctx->uc->tcg_ctx;
switchD_009f24db_caseD_4:
  arg1 = tcg_const_i32_ppc64(tcg_ctx,0);
  tcg_gen_st_i32(tcg_ctx,arg1,tcg_ctx->cpu_env,-0x1c28);
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(arg1 + (long)tcg_ctx));
  gen_exception_nip(ctx,0x10001,(ctx->base).pc_next);
  return;
}

Assistant:

static void gen_or(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int rs, ra, rb;

    rs = rS(ctx->opcode);
    ra = rA(ctx->opcode);
    rb = rB(ctx->opcode);
    /* Optimisation for mr. ri case */
    if (rs != ra || rs != rb) {
        if (rs != rb) {
            tcg_gen_or_tl(tcg_ctx, cpu_gpr[ra], cpu_gpr[rs], cpu_gpr[rb]);
        } else {
            tcg_gen_mov_tl(tcg_ctx, cpu_gpr[ra], cpu_gpr[rs]);
        }
        if (unlikely(Rc(ctx->opcode) != 0)) {
            gen_set_Rc0(ctx, cpu_gpr[ra]);
        }
    } else if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, cpu_gpr[rs]);
#if defined(TARGET_PPC64)
    } else if (rs != 0) { /* 0 is nop */
        int prio = 0;

        switch (rs) {
        case 1:
            /* Set process priority to low */
            prio = 2;
            break;
        case 6:
            /* Set process priority to medium-low */
            prio = 3;
            break;
        case 2:
            /* Set process priority to normal */
            prio = 4;
            break;
        case 31:
            if (!ctx->pr) {
                /* Set process priority to very low */
                prio = 1;
            }
            break;
        case 5:
            if (!ctx->pr) {
                /* Set process priority to medium-hight */
                prio = 5;
            }
            break;
        case 3:
            if (!ctx->pr) {
                /* Set process priority to high */
                prio = 6;
            }
            break;
        case 7:
            if (ctx->hv && !ctx->pr) {
                /* Set process priority to very high */
                prio = 7;
            }
            break;
        default:
            break;
        }
        if (prio) {
            TCGv t0 = tcg_temp_new(tcg_ctx);
            gen_load_spr(tcg_ctx, t0, SPR_PPR);
            tcg_gen_andi_tl(tcg_ctx, t0, t0, ~0x001C000000000000ULL);
            tcg_gen_ori_tl(tcg_ctx, t0, t0, ((uint64_t)prio) << 50);
            gen_store_spr(tcg_ctx, SPR_PPR, t0);
            tcg_temp_free(tcg_ctx, t0);
        }
        /*
         * Pause out of TCG otherwise spin loops with smt_low eat too
         * much CPU and the kernel hangs.  This applies to all
         * encodings other than no-op, e.g., miso(rs=26), yield(27),
         * mdoio(29), mdoom(30), and all currently undefined.
         */
        gen_pause(ctx);
#endif
    }
}